

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celfpp.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELFPP::celfppalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                  Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
                  CascadeModel model)

{
  pointer *this;
  _Map_pointer *this_00;
  __tuple_element_t<3UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> _Var1;
  __tuple_element_t<4UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> _Var2;
  size_t sVar3;
  __tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> _Var4;
  pointer puVar5;
  bool bVar6;
  ostream *poVar7;
  size_type sVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  __tuple_element_t<5UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var12
  ;
  __tuple_element_t<4UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var13
  ;
  __tuple_element_t<0UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var14
  ;
  ulong uVar15;
  __tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var16
  ;
  __tuple_element_t<3UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var17
  ;
  __tuple_element_t<1UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_> *p_Var18
  ;
  undefined8 *puVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined4 uVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  iterator local_410;
  iterator local_3f0;
  value_type_conflict2 local_3d0;
  undefined1 local_3c8 [8];
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> u_1;
  double S_CB_inf;
  size_t budget_CB;
  iterator local_380;
  iterator local_360;
  value_type_conflict2 local_340;
  undefined1 local_338 [8];
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> u;
  double S_UC_inf;
  size_t budget_UC;
  iterator local_2f0;
  iterator local_2d0;
  iterator local_2a8;
  iterator local_288;
  int local_264;
  tuple<unsigned_long,_double,_int,_double,_int,_double> local_260;
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> local_230;
  ulong local_200;
  size_t j_2;
  int local_1ec;
  tuple<unsigned_long,_double,_int,_double,_int,_double> local_1e8;
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> local_1b8;
  ulong local_188;
  size_t j_1;
  ulong local_178;
  size_t j;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  double mg2_CB;
  double mg2_UC;
  double mg1_CB;
  double mg1_UC;
  double cur_best_CB_mg1;
  double dStack_120;
  int cur_best_CB;
  double cur_best_UC_mg1;
  int cur_best_UC;
  int last_seed;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_CB;
  undefined1 local_b0 [8];
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_UC;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_CB;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_UC;
  CascadeModel model_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  undefined1 auVar26 [16];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::deque((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           *)local_b0);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::deque((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           *)&cur_best_UC);
  cur_best_UC_mg1._4_4_ = -1;
  cur_best_UC_mg1._0_4_ = -1;
  dStack_120 = 0.0;
  cur_best_CB_mg1._4_4_ = -1;
  mg1_UC = 0.0;
  mg1_CB = 0.0;
  mg2_UC = 0.0;
  mg2_CB = 0.0;
  vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar7 = std::operator<<((ostream *)&std::cout,"Initial deque start");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  for (j = 0; sVar3 = j,
      sVar8 = std::
              vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ::size(graph), sVar3 < sVar8; j = j + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&j);
    mg1_CB = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                                 model,10000);
    for (local_178 = 0; uVar15 = local_178,
        sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i),
        uVar15 < sVar8; local_178 = local_178 + 1) {
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_178);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
      std::operator<<(poVar7," ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    if (cur_best_UC_mg1._0_4_ == -1) {
      mg2_CB = mg1_CB;
    }
    else {
      j_1 = (size_t)cur_best_UC_mg1._0_4_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&j_1);
      mg2_CB = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i
                                   ,model,10000);
      for (local_188 = 0; uVar15 = local_188,
          sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i),
          uVar15 < sVar8; local_188 = local_188 + 1) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_188);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
        std::operator<<(poVar7," ");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    }
    local_1ec = 0;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,j);
    std::make_tuple<unsigned_long&,double&,int&,double&,int,double_const&>
              (&local_1e8,&j,&mg1_CB,(int *)&cur_best_UC_mg1,&mg2_CB,&local_1ec,pvVar10);
    std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>::
    tuple<unsigned_long,_double,_int,_double,_int,_double,_true,_true>(&local_1b8,&local_1e8);
    std::
    deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
    ::push_back((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                 *)local_b0,&local_1b8);
    dVar21 = mg1_CB;
    if (cur_best_UC_mg1._0_4_ == -1) {
      dStack_120 = mg1_CB;
      cur_best_UC_mg1._0_4_ =
           (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
            )j;
    }
    else if (dStack_120 < mg1_CB) {
      dStack_120 = mg1_CB;
      cur_best_UC_mg1._0_4_ =
           (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
            )j;
    }
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,j);
    mg2_UC = dVar21 / *pvVar10;
    puVar5 = (pointer)mg2_UC;
    if (cur_best_CB_mg1._4_4_ != -1) {
      j_2 = (size_t)cur_best_CB_mg1._4_4_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&j_2);
      dVar20 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i
                                   ,model,10000);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,j);
      dVar21 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (budget_list,(long)cur_best_CB_mg1._4_4_);
      vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(dVar20 / (dVar21 + *pvVar10));
      for (local_200 = 0; uVar15 = local_200,
          sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i),
          uVar15 < sVar8; local_200 = local_200 + 1) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_200);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar9);
        std::operator<<(poVar7," ");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      puVar5 = vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5;
    local_264 = 0;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,j);
    std::make_tuple<unsigned_long&,double&,int&,double&,int,double_const&>
              (&local_260,&j,&mg2_UC,(int *)((long)&cur_best_CB_mg1 + 4),
               (double *)
               &vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_264,pvVar10);
    std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>::
    tuple<unsigned_long,_double,_int,_double,_int,_double,_true,_true>(&local_230,&local_260);
    std::
    deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
    ::push_back((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                 *)&cur_best_UC,&local_230);
    if (cur_best_CB_mg1._4_4_ == -1) {
      mg1_UC = mg2_UC;
      cur_best_CB_mg1._4_4_ =
           (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
            )j;
    }
    else if (mg1_UC < mg2_UC) {
      mg1_UC = mg2_UC;
      cur_best_CB_mg1._4_4_ =
           (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
            )j;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Initial deque end");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::begin(&local_288,
          (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           *)local_b0);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::end(&local_2a8,
        (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
         *)local_b0);
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>
            (&local_288,&local_2a8);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::begin(&local_2d0,
          (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           *)&cur_best_UC);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::end(&local_2f0,
        (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
         *)&cur_best_UC);
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>
            (&local_2d0,&local_2f0);
  poVar7 = std::operator<<((ostream *)&std::cout,"Start UC");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  S_UC_inf = 0.0;
  u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  while( true ) {
    uVar30 = (undefined4)((ulong)S_UC_inf >> 0x20);
    auVar26._8_4_ = uVar30;
    auVar26._0_8_ = S_UC_inf;
    auVar26._12_4_ = 0x45300000;
    uVar25 = SUB84(S_UC_inf,0);
    if (budget <= (auVar26._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0)) break;
    do {
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)local_b0);
      p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      auVar27._8_4_ = uVar30;
      auVar27._0_8_ = S_UC_inf;
      auVar27._12_4_ = 0x45300000;
      if (*p_Var12 +
          (auVar27._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0) <= budget) break;
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                   *)local_b0);
      bVar6 = std::
              deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ::empty((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       *)local_b0);
    } while (!bVar6);
    bVar6 = std::
            deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            ::empty((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     *)local_b0);
    if (bVar6) break;
    pvVar11 = std::
              deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       *)local_b0);
    memcpy(local_338,pvVar11,0x30);
    p_Var13 = std::get<4ul,unsigned_long,double,int,double,unsigned_long,double>
                        ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                         local_338);
    _Var2 = *p_Var13;
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (_Var2 == sVar8) {
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_338);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,p_Var14);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                   *)local_b0);
      auVar23._8_4_ = uVar30;
      auVar23._0_8_ = S_UC_inf;
      auVar23._12_4_ = 0x45300000;
      p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_338);
      dVar21 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0) + *p_Var12;
      uVar15 = (ulong)dVar21;
      S_UC_inf = (double)(uVar15 | (long)(dVar21 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f);
      u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (unsigned_long)
           GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &S_CB.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,model,10000
                              );
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_338);
      cur_best_UC_mg1._4_4_ = (int)*p_Var14;
      poVar7 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_338);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*p_Var14);
      poVar7 = std::operator<<(poVar7," ");
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
      poVar7 = std::operator<<(poVar7," ");
      dVar21 = sum_budget(budget_list,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar21);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(double)u.
                                         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      p_Var16 = std::get<2ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_338);
      if (*p_Var16 == cur_best_UC_mg1._4_4_) {
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var17 = std::get<3ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        _Var1 = *p_Var17;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var18 = _Var1;
        poVar7 = std::operator<<((ostream *)&std::cout,"last seed");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_338);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,p_Var14);
        dVar21 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &S_CB.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,model
                                     ,10000);
        dVar21 = dVar21 - (double)u.
                                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var18 = dVar21;
        this = &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        _Var4 = cur_best_UC_mg1._0_4_;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var16 = std::get<2ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var16 = _Var4;
        local_340 = (value_type_conflict2)cur_best_UC_mg1._0_4_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,&local_340);
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_338);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,p_Var14);
        dVar21 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &S_CB.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,model
                                     ,10000);
        dVar21 = dVar21 - (double)u.
                                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var17 = std::get<3ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var17 = dVar21;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      dVar21 = dStack_120;
      if (cur_best_UC_mg1._0_4_ == -1) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = "cur_best_UC should not be -1";
        __cxa_throw(puVar19,&char_const*::typeinfo,0);
      }
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)local_b0);
      p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      if (dVar21 < *p_Var18) {
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)local_b0);
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        cur_best_UC_mg1._0_4_ =
             (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
              )*p_Var14;
      }
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)local_b0);
      p_Var13 = std::get<4ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      *p_Var13 = sVar8;
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::begin(&local_360,
              (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               *)local_b0);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::end(&local_380,
            (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             *)local_b0);
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>
                (&local_360,&local_380);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"End UC");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"Start CB");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  S_CB_inf = 0.0;
  u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  while( true ) {
    uVar30 = (undefined4)((ulong)S_CB_inf >> 0x20);
    auVar28._8_4_ = uVar30;
    auVar28._0_8_ = S_CB_inf;
    auVar28._12_4_ = 0x45300000;
    uVar25 = SUB84(S_CB_inf,0);
    if (budget <= (auVar28._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0)) break;
    do {
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)&cur_best_UC);
      p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      auVar29._8_4_ = uVar30;
      auVar29._0_8_ = S_CB_inf;
      auVar29._12_4_ = 0x45300000;
      if (*p_Var12 +
          (auVar29._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0) <= budget) break;
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                   *)&cur_best_UC);
      bVar6 = std::
              deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ::empty((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       *)&cur_best_UC);
    } while (!bVar6);
    bVar6 = std::
            deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            ::empty((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     *)&cur_best_UC);
    if (bVar6) break;
    pvVar11 = std::
              deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       *)&cur_best_UC);
    memcpy(local_3c8,pvVar11,0x30);
    p_Var13 = std::get<4ul,unsigned_long,double,int,double,unsigned_long,double>
                        ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                         local_3c8);
    _Var2 = *p_Var13;
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (_Var2 == sVar8) {
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_3c8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,p_Var14);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                   *)&cur_best_UC);
      auVar24._8_4_ = uVar30;
      auVar24._0_8_ = S_CB_inf;
      auVar24._12_4_ = 0x45300000;
      p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_3c8);
      dVar21 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0) + *p_Var12;
      uVar15 = (ulong)dVar21;
      S_CB_inf = (double)(uVar15 | (long)(dVar21 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f);
      u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (unsigned_long)
           GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &Q_UC.
                                      super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node,model,10000)
      ;
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_3c8);
      cur_best_UC_mg1._4_4_ = (int)*p_Var14;
      poVar7 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_3c8);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*p_Var14);
      poVar7 = std::operator<<(poVar7," ");
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
      poVar7 = std::operator<<(poVar7," ");
      dVar21 = sum_budget(budget_list,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &Q_UC.
                           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar21);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(double)u_1.
                                         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      p_Var16 = std::get<2ul,unsigned_long,double,int,double,unsigned_long,double>
                          ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                           local_3c8);
      if (*p_Var16 == cur_best_UC_mg1._4_4_) {
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var17 = std::get<3ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        _Var1 = *p_Var17;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var18 = _Var1;
      }
      else {
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_3c8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,p_Var14);
        dVar20 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &Q_UC.
                                            super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node,model,
                                     10000);
        dVar20 = dVar20 - (double)u_1.
                                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_3c8);
        dVar21 = *p_Var12;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var18 = dVar20 / dVar21;
        this_00 = &Q_UC.
                   super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
        _Var4 = cur_best_CB_mg1._4_4_;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var16 = std::get<2ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var16 = _Var4;
        local_3d0 = (value_type_conflict2)cur_best_CB_mg1._4_4_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_3d0);
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_3c8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,p_Var14);
        dVar22 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &Q_UC.
                                            super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node,model,
                                     10000);
        dVar22 = dVar22 - (double)u_1.
                                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        p_Var12 = std::get<5ul,unsigned_long,double,int,double,unsigned_long,double>
                            ((tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)
                             local_3c8);
        dVar21 = *p_Var12;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (budget_list,(long)cur_best_CB_mg1._4_4_);
        dVar20 = *pvVar10;
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var17 = std::get<3ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        *p_Var17 = dVar22 / (dVar21 + dVar20);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
      }
      dVar21 = mg1_UC;
      if (cur_best_CB_mg1._4_4_ == -1) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = "cur_best_CB should not be -1";
        __cxa_throw(puVar19,&char_const*::typeinfo,0);
      }
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)&cur_best_UC);
      p_Var18 = std::get<1ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      if (dVar21 < *p_Var18) {
        pvVar11 = std::
                  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           *)&cur_best_UC);
        p_Var14 = std::get<0ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
        cur_best_CB_mg1._4_4_ =
             (__tuple_element_t<2UL,_tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>
              )*p_Var14;
      }
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node);
      pvVar11 = std::
                deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ::front((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                         *)&cur_best_UC);
      p_Var13 = std::get<4ul,unsigned_long,double,int,double,unsigned_long,double>(pvVar11);
      *p_Var13 = sVar8;
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::begin(&local_3f0,
              (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               *)&cur_best_UC);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::end(&local_410,
            (deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             *)&cur_best_UC);
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>
                (&local_3f0,&local_410);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"End CB");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  if ((double)u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl <=
      (double)u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
    poVar7 = std::operator<<((ostream *)&std::cout,"UC_inf: ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(double)u.
                                       super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"CB_inf: ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(double)u_1.
                                       super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &Q_UC.
                super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~deque((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            *)&cur_best_UC);
  std::
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~deque((deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            *)local_b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> celfppalgo (const Graph & graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_UC;
        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_CB;

        int last_seed = -1;
        int cur_best_UC = -1;
        double cur_best_UC_mg1 = 0;
        int cur_best_CB = -1;
        double cur_best_CB_mg1 = 0;
        double mg1_UC = 0;
        double mg1_CB = 0;
        double mg2_UC = 0;
        double mg2_CB = 0;
        std::cout << "Initial deque start" << std::endl;
        std::vector<size_t> vecSeed;
        for (size_t i = 0; i < graph.size(); i++) {
            vecSeed.push_back(i);

            // initial UC
            mg1_UC = GraphBase::inf_eval(graph, vecSeed, model);
            for (size_t j = 0; j < vecSeed.size(); j++) {
                std::cout << vecSeed[j] << " ";
            }
            std::cout << std::endl;
            if (cur_best_UC != -1) {
                vecSeed.push_back(cur_best_UC);
                mg2_UC = GraphBase::inf_eval(graph, vecSeed, model);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_UC = mg1_UC;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            Q_UC.push_back(std::make_tuple(i, mg1_UC, cur_best_UC, mg2_UC, 0, budget_list[i]));
            if (cur_best_UC == -1) {
                cur_best_UC = i;
                cur_best_UC_mg1 = mg1_UC;
            }
            else {
                if(cur_best_UC_mg1 < mg1_UC) {
                    cur_best_UC = i;
                    cur_best_UC_mg1 = mg1_UC;
                }
            }

            // initial CB
            mg1_CB = mg1_UC / budget_list[i];
            if (cur_best_CB != -1) {
                vecSeed.push_back(cur_best_CB);
                mg2_CB = GraphBase::inf_eval(graph, vecSeed, model) / (budget_list[i] + budget_list[cur_best_CB]);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_CB = mg1_CB;
            }

            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            Q_CB.push_back(std::make_tuple(i, mg1_CB, cur_best_CB, mg2_CB, 0, budget_list[i]));
            if (cur_best_CB == -1) {
                cur_best_CB = i;
                cur_best_CB_mg1 = mg1_CB;
            }
            else {
                if (cur_best_CB_mg1 < mg1_CB) {
                    cur_best_CB = i;
                    cur_best_CB_mg1 = mg1_CB;
                }
            }
            vecSeed.pop_back();
        }
        std::cout << "Initial deque end" << std::endl;

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::cout << "Start UC" << std::endl;
        size_t budget_UC = 0;
        double S_UC_inf = 0;
        while (budget_UC < budget) {
            while (std::get<5>(Q_UC.front()) + budget_UC > budget) {
                Q_UC.pop_front();
                if (Q_UC.empty()) {
                    break;
                }
            }
            if (Q_UC.empty()) {
                break;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_UC.front();
            if (std::get<4>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<5>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                          sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                std::get<1>(Q_UC.front()) = std::get<3>(Q_UC.front());   // u u.mg1 u.prev_best u.mg2 u.flag u.cost
                std::cout << "last seed" << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<2>(Q_UC.front()) = cur_best_UC;
                S_UC.push_back(cur_best_UC);
                S_UC.push_back(std::get<0>(u));
                std::get<3>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                S_UC.pop_back();
            }

            if (cur_best_UC != -1){
                if (cur_best_UC_mg1 < std::get<1>(Q_UC.front())) {
                    cur_best_UC = std::get<0>(Q_UC.front());
                }
            }
            else {
                throw "cur_best_UC should not be -1";
            }

            std::get<4>(Q_UC.front()) = S_UC.size();
            std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End UC" << std::endl;

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::cout << "Start CB" << std::endl;
        size_t budget_CB = 0;
        double S_CB_inf = 0;
        while (budget_CB < budget) {
            while (std::get<5>(Q_CB.front()) + budget_CB > budget) {
                Q_CB.pop_front();
                if (Q_CB.empty()) {
                    break;
                }
            }
            if (Q_CB.empty()) {
                break;
            }
            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_CB.front();
            if (std::get<4>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<5>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                          sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
                std::get<1>(Q_CB.front()) = std::get<3>(Q_CB.front());
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<5>(u);
                S_CB.pop_back();
                std::get<2>(Q_CB.front()) = cur_best_CB;
                S_CB.push_back(cur_best_CB);
                S_CB.push_back(std::get<0>(u));
                std::get<3>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) /
                        (std::get<5>(u) + budget_list[cur_best_CB]);
                S_CB.pop_back();
                S_CB.pop_back();
            }
            if (cur_best_CB != -1){
                if(cur_best_CB_mg1 < std::get<1>(Q_CB.front())){
                    cur_best_CB = std::get<0>(Q_CB.front());
                }
            }
            else {
                throw "cur_best_CB should not be -1";
            }
            std::get<4>(Q_CB.front()) = S_CB.size();
            std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End CB" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }